

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O2

void __thiscall ThreadPool::ThreadPool(ThreadPool *this,size_t threads)

{
  bool bVar1;
  anon_class_8_1_8991fb9c_for__M_head_impl local_38;
  
  (this->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            (&this->tasks);
  (this->queue_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->queue_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->queue_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->queue_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->queue_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->condition);
  (this->sync_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->sync_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->sync_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->sync_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->sync_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->sync_condition);
  this->stop = false;
  (this->sync).super___atomic_base<int>._M_i = 0;
  while (bVar1 = threads != 0, threads = threads - 1, bVar1) {
    local_38.this = this;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<ThreadPool::ThreadPool(unsigned_long)::_lambda()_1_>
              ((vector<std::thread,std::allocator<std::thread>> *)this,&local_38);
  }
  return;
}

Assistant:

inline ThreadPool::ThreadPool(size_t threads)
    : stop(false) {
  for(size_t i = 0; i<threads; ++i)
    workers.emplace_back(
      [this]
      {
        for(;;) {
          std::function<void()> task;
          {
            std::unique_lock<std::mutex> lock(this->queue_mutex);
            this->condition.wait(lock,
              [this]{ return this->stop || !this->tasks.empty(); });
            if (this->stop && this->tasks.empty()) {
              return;
            }
            task = std::move(this->tasks.front());
            this->tasks.pop();
          }
          task();
          {
            std::unique_lock<std::mutex> lock(this->sync_mutex);
            sync++;
            sync_condition.notify_one();
          }
       }
     }
   );
}